

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::BiasLayerParams::MergePartialFromCodedStream
          (BiasLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int byte_limit;
  WeightParams *this_00;
  pair<int,_int> pVar7;
  ulong uVar8;
  
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0022eea2;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0022eea2:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_0022ef2e:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    }
    else {
      uVar6 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar6 == 2) {
        if ((char)uVar8 == '\x12') {
          this_00 = this->bias_;
          if (this_00 == (WeightParams *)0x0) {
            this_00 = (WeightParams *)operator_new(0x50);
            WeightParams::WeightParams(this_00);
            this->bias_ = this_00;
          }
          puVar3 = input->buffer_;
          if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < byte_limit)) {
            input->buffer_ = puVar3 + 1;
          }
          else {
            byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (byte_limit < 0) {
              return false;
            }
          }
          pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,byte_limit);
          if ((long)pVar7 < 0) {
            return false;
          }
          bVar4 = WeightParams::MergePartialFromCodedStream(this_00,input);
          if (!bVar4) {
            return false;
          }
          bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar7.first);
          goto LAB_0022ef46;
        }
        goto LAB_0022ef2e;
      }
      if (uVar6 != 1) goto LAB_0022ef2e;
      if ((char)uVar8 == '\b') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (1,10,input,&this->shape_);
      }
      else {
        if ((uVar5 & 0xff) != 10) goto LAB_0022ef2e;
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->shape_);
      }
    }
LAB_0022ef46:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool BiasLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BiasLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated uint64 shape = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_shape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 1, 10u, input, this->mutable_shape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams bias = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BiasLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BiasLayerParams)
  return false;
#undef DO_
}